

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

void __thiscall QProgressBarPrivate::resetLayoutItemMargins(QProgressBarPrivate *this)

{
  long lVar1;
  QProgressBar *pQVar2;
  QProgressBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QProgressBar *q;
  QStyleOptionProgressBar option;
  QStyleOptionProgressBar *this_00;
  QStyleOption *opt;
  LayoutDirection element;
  QWidgetPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  this_01 = (QWidgetPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt = (QStyleOption *)&DAT_aaaaaaaaaaaaaaaa;
  element = 0xaaaaaaaa;
  this_00 = (QStyleOptionProgressBar *)&stack0xffffffffffffff88;
  QStyleOptionProgressBar::QStyleOptionProgressBar((QStyleOptionProgressBar *)0x664140);
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1a8))(pQVar2,this_00);
  QWidgetPrivate::setLayoutItemMargins(this_01,element,opt);
  QStyleOptionProgressBar::~QStyleOptionProgressBar(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBarPrivate::resetLayoutItemMargins()
{
    Q_Q(QProgressBar);
    QStyleOptionProgressBar option;
    // ### It seems like this can be called directly from the constructor which should be avoided
    // ### if possible, since we will not call a possible re-implemented version
    q->initStyleOption(&option);
    setLayoutItemMargins(QStyle::SE_ProgressBarLayoutItem, &option);
}